

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O3

MkTimeResult *
anon_unknown.dwarf_5972d7::resolveLocalTime
          (MkTimeResult *__return_storage_ptr__,qint64 local,TransitionOptions resolve)

{
  undefined8 uVar1;
  tm base;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  undefined8 *puVar5;
  ulong uVar6;
  undefined8 *puVar7;
  long in_FS_OFFSET;
  byte bVar8;
  YearMonthDay YVar9;
  tm local_resb8;
  MkTimeResult flipped;
  MkTimeResult in_stack_fffffffffffffe70;
  tm local_148;
  tm local_110;
  undefined1 local_d8 [8];
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  uint local_b8;
  int iStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined1 *puStack_a0;
  undefined8 local_98;
  int iStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [32];
  undefined1 *local_58;
  undefined1 *puStack_50;
  char *local_48;
  undefined1 *puStack_40;
  undefined8 local_38;
  MkTimeResult *local_28;
  
  bVar8 = 0;
  local_28 = *(MkTimeResult **)(in_FS_OFFSET + 0x28);
  if (local < 0) {
    uVar4 = (ulong)~local / 0x15180;
    uVar6 = ~uVar4;
    uVar4 = (uVar4 * 0x15180 - ~local) + 0x1517f;
  }
  else {
    uVar6 = (ulong)local / 0x15180;
    uVar4 = (ulong)local % 0x15180;
  }
  YVar9 = QGregorianCalendar::partsFromJulian(uVar6 + 0x253d8c);
  local_110.tm_mday = YVar9.day;
  local_110.tm_wday = 0;
  local_110.tm_yday = 0;
  local_110.tm_gmtoff = 0;
  local_110.tm_zone = (char *)0x0;
  local_110.tm_year = (YVar9.year - (YVar9.year >> 0x1f)) + -0x76c;
  local_110.tm_mon = YVar9.month + -1;
  local_110.tm_hour = (int)((uVar4 & 0xffffffff) / 0xe10);
  local_110.tm_min = (uint)(((int)uVar4 + local_110.tm_hour * -0xe10) * 0x889) >> 0x11;
  local_110.tm_sec = (int)uVar4 + (int)((uVar4 & 0xffffffff) / 0x3c) * -0x3c;
  local_110.tm_isdst = -1;
  local_110._36_4_ = 0;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = 0xaaaaaaaa;
  uStack_a4 = 0xaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = 0xaaaaaaaa;
  iStack_b4 = -0x55555556;
  uStack_b0 = 0xaaaaaaaa;
  uStack_ac = 0xaaaaaaaa;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
  MkTimeResult::MkTimeResult((MkTimeResult *)local_d8,&local_110);
  if (local_98._0_1_ == false) {
    puVar5 = (undefined8 *)local_d8;
    puVar7 = (undefined8 *)&stack0xfffffffffffffe70;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar7 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
      puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
    }
    base.tm_min = local_110.tm_min;
    base.tm_sec = local_110.tm_sec;
    base.tm_mday = local_110.tm_mday;
    base.tm_hour = local_110.tm_hour;
    base.tm_year = local_110.tm_year;
    base.tm_mon = local_110.tm_mon;
    base.tm_wday = local_110.tm_wday;
    base.tm_yday = local_110.tm_yday;
    base.tm_isdst = local_110.tm_isdst;
    base._36_4_ = local_110._36_4_;
    base.tm_gmtoff = local_110.tm_gmtoff;
    base.tm_zone = local_110.tm_zone;
    resolveRejected(__return_storage_ptr__,base,in_stack_fffffffffffffe70,resolve);
    goto LAB_001651f2;
  }
  if (-1 < (int)local_b8) {
    if (local_98._1_1_ == true) {
      if (((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                 super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i & 6) == 0) {
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        puStack_d0 = (undefined1 *)0x0;
        local_c8 = (undefined1 *)0x0;
        puStack_c0 = (undefined1 *)0x0;
        local_78._4_4_ = 0;
        local_78._8_4_ = 0;
        local_78._12_4_ = 0;
        local_78._16_4_ = 0;
        local_b8 = -1;
        iStack_b4 = local_78._0_4_;
        uStack_b0 = 0;
        uStack_ac = 0;
        local_a8 = 0;
LAB_00164f18:
        local_a8 = 0;
        uStack_ac = 0;
        uStack_b0 = 0;
        local_b8 = 0xffffffff;
        puStack_c0 = (undefined1 *)0x0;
        local_c8 = (undefined1 *)0x0;
        puStack_d0 = (undefined1 *)0x0;
        local_d8 = (undefined1  [8])0x0;
        uStack_a4 = 0;
        puStack_a0 = (undefined1 *)0xffffffffffffffff;
        local_98 = (undefined1 *)CONCAT62(local_98._2_6_,0x100);
      }
      else {
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_78._16_4_ = -0x55555556;
        local_78._20_4_ = -0x55555556;
        local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._0_4_ = -0x55555556;
        local_78._4_4_ = -0x55555556;
        local_78._8_4_ = -0x55555556;
        local_78._12_4_ = -0x55555556;
        hopAcrossGap((MkTimeResult *)local_78,(MkTimeResult *)local_d8,&local_110);
        uVar2 = (uint)(((uint)local_58 != 1) == (long)puStack_a0 < (long)puStack_40) * 2 - 5;
        if ((local_b8 ^ (uint)local_58) != 1) {
          uVar2 = 0xfffffffb;
        }
        if (((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                   super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i & 0x400) == 0) {
          uVar2 = 0xfffffffb;
        }
        if ((long)puStack_a0 < (long)puStack_40 !=
            ((uVar2 | (uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>
                            .super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i) !=
            0xffffffff)) {
          if ((local_38._0_1_ != true) || (local_38._1_1_ == true)) {
            (__return_storage_ptr__->local).tm_mon = 0;
            (__return_storage_ptr__->local).tm_year = 0;
            (__return_storage_ptr__->local).tm_wday = 0;
            (__return_storage_ptr__->local).tm_yday = 0;
            (__return_storage_ptr__->local).tm_sec = 0;
            (__return_storage_ptr__->local).tm_min = 0;
            (__return_storage_ptr__->local).tm_hour = 0;
            (__return_storage_ptr__->local).tm_mday = 0;
            (__return_storage_ptr__->local).tm_gmtoff = 0;
            (__return_storage_ptr__->local).tm_zone = (char *)0x0;
            __return_storage_ptr__->utcSecs = -1;
            __return_storage_ptr__->good = false;
            __return_storage_ptr__->adjusted = true;
            (__return_storage_ptr__->local).tm_isdst = -1;
            goto LAB_001651f2;
          }
          puVar5 = (undefined8 *)local_78;
          puVar7 = (undefined8 *)local_d8;
          for (lVar3 = 8; lVar3 != 0; lVar3 = lVar3 + -1) {
            *puVar7 = *puVar5;
            puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
            puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
          }
          local_98._0_1_ = SUB81(local_38,0);
          local_98._0_2_ = CONCAT11(true,local_98._0_1_);
        }
      }
    }
    else if ((((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                     super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i >> 10 & 1) == 0) ||
            (((uint)(local_b8 != 0) * 0x20 - 0x441 |
             (uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                   super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i) != 0xffffffff)) {
      local_148.tm_min = local_110.tm_min;
      local_148.tm_sec = local_110.tm_sec;
      local_148.tm_mday = local_110.tm_mday;
      local_148.tm_hour = local_110.tm_hour;
      local_148.tm_year = local_110.tm_year;
      local_148.tm_mon = local_110.tm_mon;
      local_148.tm_gmtoff = local_110.tm_gmtoff;
      local_148.tm_zone = local_110.tm_zone;
      local_148.tm_wday = local_110.tm_wday;
      local_148.tm_yday = local_110.tm_yday;
      local_148._36_4_ = local_110._36_4_;
      local_148.tm_isdst = (uint)(local_b8 == 0);
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_78._16_4_ = -0x55555556;
      local_78._20_4_ = -0x55555556;
      local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_4_ = -0x55555556;
      local_78._4_4_ = -0x55555556;
      local_78._8_4_ = -0x55555556;
      local_78._12_4_ = -0x55555556;
      MkTimeResult::MkTimeResult((MkTimeResult *)local_78,&local_148);
      if ((local_38._0_1_ == true) && (local_38._1_1_ == false)) {
        if (((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                   super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i & 0x60) == 0) {
          local_d8._0_4_ = 0;
          local_d8._4_4_ = 0;
          puStack_d0 = (undefined1 *)0x0;
          local_c8 = (undefined1 *)0x0;
          puStack_c0 = (undefined1 *)0x0;
          local_88 = 0;
          uStack_84 = 0;
          uStack_80 = 0;
          uStack_7c = 0;
          local_b8 = -1;
          iStack_b4 = iStack_8c;
          uStack_b0 = 0;
          uStack_ac = 0;
          local_a8 = 0;
          goto LAB_00164f18;
        }
        uVar2 = (uint)(((uint)local_58 == 1) == (long)puStack_a0 < (long)puStack_40) * 0x20 - 0x41;
        if ((local_b8 ^ (uint)local_58) != 1) {
          uVar2 = 0xffffffbf;
        }
        if (((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                   super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i & 0x400) == 0) {
          uVar2 = 0xffffffbf;
        }
        if ((long)puStack_a0 < (long)puStack_40 !=
            ((uVar2 | (uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>
                            .super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i) !=
            0xffffffff)) {
          puVar5 = (undefined8 *)local_78;
          puVar7 = (undefined8 *)local_d8;
          for (lVar3 = 8; lVar3 != 0; lVar3 = lVar3 + -1) {
            *puVar7 = *puVar5;
            puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
            puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
          }
          local_98 = (undefined1 *)CONCAT62(local_98._2_6_,(undefined2)local_38);
        }
      }
    }
  }
  puVar5 = (undefined8 *)local_d8;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *puVar5;
    (__return_storage_ptr__->local).tm_sec = (int)uVar1;
    (__return_storage_ptr__->local).tm_min = (int)((ulong)uVar1 >> 0x20);
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    __return_storage_ptr__ =
         (MkTimeResult *)((long)__return_storage_ptr__ + (ulong)bVar8 * -0x10 + 8);
  }
LAB_001651f2:
  if (*(MkTimeResult **)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return *(MkTimeResult **)(in_FS_OFFSET + 0x28);
}

Assistant:

MkTimeResult resolveLocalTime(qint64 local, QDateTimePrivate::TransitionOptions resolve)
{
    const auto localDaySecs = QRoundingDown::qDivMod<SECS_PER_DAY>(local);
    struct tm base = timeToTm(localDaySecs.quotient, localDaySecs.remainder);

    // Get provisional result (correct > 99.9 % of the time):
    MkTimeResult result(base);

    // Our callers (mostly) deal with questions of being within the range that
    // system time_t functions can handle, and timeToTm() gave us data in
    // normalized form, so the only excuse for !good or a change to the HH:mm:ss
    // fields (aside from being at the boundary of time_t's supported range) is
    // that we hit a gap, although we have to handle these cases differently:
    if (!result.good) {
        // Rejected. The tricky case: maybe mktime() doesn't resolve gaps.
        return resolveRejected(base, result, resolve);
    } else if (result.local.tm_isdst < 0) {
        // Apparently success without knowledge of whether this is DST or not.
        // Should not happen, but that means our usual understanding of what the
        // system is up to has gone out the window. So just let it be.
    } else if (result.adjusted) {
        // Shunted out of a gap.
        if (!resolve.testAnyFlags(QDateTimePrivate::GapMask)) {
            result = {};
            return result;
        }

        // Try to obtain a matching point on the other side of the gap:
        const MkTimeResult flipped = hopAcrossGap(result, base);
        // Even if that failed, result may be the correct resolution

        if (preferAlternative(resolve, result.local.tm_isdst, flipped.local.tm_isdst,
                              flipped.utcSecs > result.utcSecs, true)) {
            // If hopAcrossGap() failed and we do need its answer, give up.
            if (!flipped.good || flipped.adjusted)
                return {};

            // As resolution of local, flipped involves adjustment (across gap):
            result = flipped;
            result.adjusted = true;
        }
    } else if (resolve.testFlag(QDateTimePrivate::FlipForReverseDst)
               // In fold, DST counts as before and standard as after -
               // we may not need to check whether we're in a transition:
               && resolve.testFlag(result.local.tm_isdst ? QDateTimePrivate::FoldUseBefore
                                                         : QDateTimePrivate::FoldUseAfter)) {
        // We prefer DST or standard and got what we wanted, so we're good.
        // As below, but we don't need to check, because we're on the side of
        // the transition that it would select as valid, if we were near one.
        // NB: this branch is routinely exercised, when QDT::Data::isShort()
        // obliges us to rediscover an offsetFromUtc that ShortData has no space
        // to store, as it does remember the DST status we got before.
    } else {
        // What we gave was valid. However, it might have been in a fall-back.
        // If so, the same input but with tm_isdst flipped should also be valid.
        struct tm copy = base;
        copy.tm_isdst = !result.local.tm_isdst;
        const MkTimeResult flipped(copy);
        if (flipped.good && !flipped.adjusted) {
            // We're in a fall-back
            if (!resolve.testAnyFlags(QDateTimePrivate::FoldMask)) {
                result = {};
                return result;
            }

            // Work out which repeat to use:
            if (preferAlternative(resolve, result.local.tm_isdst, flipped.local.tm_isdst,
                                  flipped.utcSecs > result.utcSecs, false)) {
                result = flipped;
            }
        } // else: not in a transition, nothing to worry about.
    }
    return result;
}